

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_listener.cpp
# Opt level: O0

void __thiscall
chatter::PacketLoggerCSV::on_send
          (PacketLoggerCSV *this,uint64_t ts,PacketStats *packet_stats,PeerStats *peer_stats)

{
  ulong uVar1;
  ostream *poVar2;
  string local_48 [32];
  PeerStats *local_28;
  PeerStats *peer_stats_local;
  PacketStats *packet_stats_local;
  uint64_t ts_local;
  PacketLoggerCSV *this_local;
  
  local_28 = peer_stats;
  peer_stats_local = (PeerStats *)packet_stats;
  packet_stats_local = (PacketStats *)ts;
  ts_local = (uint64_t)this;
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&this->m_file,(ulong)packet_stats_local)
    ;
    poVar2 = std::operator<<(poVar2," SEND>>>  ");
    PacketListener::debug_string_abi_cxx11_
              ((PacketListener *)local_48,(PacketStats *)this,peer_stats_local);
    poVar2 = std::operator<<(poVar2,local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void PacketLoggerCSV::on_send(uint64_t ts, const PacketStats& packet_stats, const PeerStats& peer_stats)
{
    if (!m_file.is_open())
        return;
    m_file << ts << " SEND>>>  " << debug_string(packet_stats, peer_stats) << std::endl;
}